

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O3

PHYSFS_sint64 PHYSFS_tell(PHYSFS_File *handle)

{
  long lVar1;
  PHYSFS_sint64 PVar2;
  
  lVar1 = (**(code **)((long)handle->opaque + 0x28))();
  if (*(char *)&handle[1].opaque == '\0') {
    PVar2 = lVar1 + (long)handle[5].opaque;
  }
  else {
    PVar2 = (lVar1 - (long)handle[5].opaque) + (long)handle[6].opaque;
  }
  return PVar2;
}

Assistant:

PHYSFS_sint64 PHYSFS_tell(PHYSFS_File *handle)
{
    FileHandle *fh = (FileHandle *) handle;
    const PHYSFS_sint64 pos = fh->io->tell(fh->io);
    const PHYSFS_sint64 retval = fh->forReading ?
                                 (pos - fh->buffill) + fh->bufpos :
                                 (pos + fh->buffill);
    return retval;
}